

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gguf.cpp
# Opt level: O0

bool handcrafted_check_tensors(gguf_context *gguf_ctx,uint seed)

{
  bool bVar1;
  undefined4 uVar2;
  ggml_type gVar3;
  undefined8 uVar4;
  size_type sVar5;
  reference pvVar6;
  const_reference pvVar7;
  long lVar8;
  undefined8 *puVar9;
  long in_RDI;
  undefined8 *puVar10;
  byte bVar11;
  size_t j;
  int64_t ne;
  size_t offset;
  int id;
  string name;
  array<long,_4UL> shape;
  ggml_type type;
  int i;
  uint64_t expected_offset;
  uint32_t alignment;
  int id_alignment;
  bool ok;
  vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  tensor_configs;
  mt19937 rng;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffc3d8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffc3e0;
  char *in_stack_ffffffffffffc3e8;
  vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  *in_stack_ffffffffffffc3f0;
  allocator<char> *in_stack_ffffffffffffc410;
  char *in_stack_ffffffffffffc418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffc420;
  int in_stack_ffffffffffffc42c;
  undefined1 in_stack_ffffffffffffc460 [5000];
  undefined1 auVar12 [5000];
  mt19937 rng_00;
  undefined1 auVar13 [5000];
  undefined1 auVar14 [5000];
  undefined1 auVar15 [5000];
  undefined1 auVar16 [5000];
  undefined1 auVar17 [5000];
  undefined1 auVar18 [5000];
  undefined1 auVar19 [5000];
  undefined1 auVar20 [5000];
  undefined1 auVar21 [5000];
  undefined1 auVar22 [5000];
  undefined1 auVar23 [5000];
  undefined1 auVar24 [5000];
  undefined1 auVar25 [5000];
  undefined1 auVar26 [5000];
  undefined1 auVar27 [5000];
  undefined1 auVar28 [5000];
  allocator<char> local_2811;
  string local_2810 [36];
  int local_27ec;
  string local_27e8 [32];
  string local_27c8 [32];
  long local_27a8;
  long lStack_27a0;
  long local_2798;
  long lStack_2790;
  ggml_type local_2780;
  int local_277c;
  long local_2778;
  uint local_2770;
  int local_276c;
  byte local_2765;
  undefined1 local_2758 [5024];
  vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  local_13b8;
  undefined1 local_13a0 [5008];
  long local_10;
  byte local_1;
  
  bVar11 = 0;
  if (in_RDI == 0) {
    local_1 = 0;
  }
  else {
    auVar12._4968_32_ = in_stack_ffffffffffffc460._4968_32_;
    auVar12._0_4960_ = in_stack_ffffffffffffc460._0_4960_;
    auVar12._4960_8_ = local_13a0;
    local_10 = in_RDI;
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine(in_stack_ffffffffffffc3e0,(result_type)in_stack_ffffffffffffc3d8);
    get_tensor_configs(auVar12._72_8_);
    rng_00._4976_24_ = auVar12._4976_24_;
    rng_00._M_x._0_4968_ = auVar12._0_4968_;
    rng_00._M_x[0x26d] = (unsigned_long)local_2758;
    memcpy(local_2758,auVar12._4960_8_,5000);
    puVar9 = rng_00._M_x[0x26d];
    puVar10 = (undefined8 *)&stack0xffffffffffffc3d8;
    for (lVar8 = 0x271; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar10 = *puVar9;
      puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
      puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
    }
    get_kv_types(rng_00);
    std::vector<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
    ::~vector((vector<std::pair<gguf_type,_gguf_type>,_std::allocator<std::pair<gguf_type,_gguf_type>_>_>
               *)in_stack_ffffffffffffc3f0);
    local_2765 = 1;
    uVar4 = gguf_find_key(local_10,"general.alignment");
    auVar13._4960_40_ = rng_00._4960_40_;
    auVar13._0_4952_ = rng_00._M_x._0_4952_;
    auVar13._4952_8_ = uVar4;
    local_276c = (int)uVar4;
    if (local_276c < 0) {
      auVar28._4948_52_ = auVar13._4948_52_;
      auVar28._0_4944_ = rng_00._M_x._0_4944_;
      auVar28._4944_4_ = 0x20;
    }
    else {
      uVar2 = gguf_get_val_u32(local_10,(long)local_276c);
      auVar14._4952_48_ = auVar13._4952_48_;
      auVar14._0_4948_ = auVar13._0_4948_;
      auVar14._4948_4_ = uVar2;
      auVar28._4948_52_ = auVar14._4948_52_;
      auVar28._0_4944_ = auVar13._0_4944_;
      auVar28._4944_4_ = uVar2;
    }
    local_2770 = auVar28._4944_4_;
    local_2778 = 0;
    local_277c = 0;
    while( true ) {
      auVar15._4944_56_ = auVar28._4944_56_;
      auVar15._0_4940_ = auVar28._0_4940_;
      auVar15._4940_4_ = local_277c;
      sVar5 = std::
              vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
              ::size(&local_13b8);
      if ((int)sVar5 <= auVar15._4940_4_) break;
      auVar16._4936_64_ = auVar15._4936_64_;
      auVar16._0_4928_ = auVar15._0_4928_;
      auVar16._4928_8_ = &local_13b8;
      pvVar6 = std::
               vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
               ::operator[](&local_13b8,(long)local_277c);
      local_2780 = pvVar6->first;
      pvVar6 = std::
               vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
               ::operator[](auVar16._4928_8_,(long)local_277c);
      local_27a8 = (pvVar6->second)._M_elems[0];
      lStack_27a0 = (pvVar6->second)._M_elems[1];
      local_2798 = (pvVar6->second)._M_elems[2];
      lStack_2790 = (pvVar6->second)._M_elems[3];
      std::__cxx11::to_string(in_stack_ffffffffffffc42c);
      std::operator+(in_stack_ffffffffffffc3e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffc3e0);
      std::__cxx11::string::~string(local_27e8);
      auVar17._4920_80_ = auVar16._4920_80_;
      auVar17._0_4912_ = auVar16._0_4912_;
      auVar17._4912_8_ = local_10;
      uVar4 = std::__cxx11::string::c_str();
      uVar4 = gguf_find_tensor(auVar17._4912_8_,uVar4);
      auVar28._4928_72_ = auVar17._4928_72_;
      auVar28._0_4920_ = auVar17._0_4920_;
      auVar28._4920_8_ = uVar4;
      local_27ec = (int)uVar4;
      if (local_27ec < 0) {
        local_2765 = 0;
      }
      else {
        uVar4 = gguf_get_tensor_name(local_10,(long)local_27ec);
        auVar18._4912_88_ = auVar28._4912_88_;
        auVar18._0_4904_ = auVar28._0_4904_;
        auVar18._4904_8_ = uVar4;
        auVar19._4904_96_ = auVar18._4904_96_;
        auVar19._0_4896_ = auVar28._0_4896_;
        auVar19._4896_8_ = &local_2811;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffc420,in_stack_ffffffffffffc418,in_stack_ffffffffffffc410);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffc3e0,in_stack_ffffffffffffc3d8);
        auVar20._4896_104_ = auVar19._4896_104_;
        auVar20._0_4895_ = auVar19._0_4895_;
        auVar20[0x131f] = bVar1;
        std::__cxx11::string::~string(local_2810);
        std::allocator<char>::~allocator(&local_2811);
        if ((auVar20 & (undefined1  [5000])0x100000000000000) != (undefined1  [5000])0x0) {
          local_2765 = 0;
        }
        gVar3 = gguf_get_tensor_type(local_10,(long)local_27ec);
        auVar21._4892_108_ = auVar20._4892_108_;
        auVar21._0_4888_ = auVar20._0_4888_;
        auVar21._4888_4_ = gVar3;
        if (gVar3 != local_2780) {
          local_2765 = 0;
        }
        lVar8 = gguf_get_tensor_offset(local_10,(long)local_27ec);
        auVar22._4888_112_ = auVar21._4888_112_;
        auVar22._0_4880_ = auVar21._0_4880_;
        auVar22._4880_8_ = lVar8;
        auVar23._0_4992_ = auVar22._0_4992_;
        auVar23._4992_8_ = lVar8;
        if (lVar8 != local_2778) {
          local_2765 = 0;
        }
        pvVar7 = std::array<long,_4UL>::operator[]
                           ((array<long,_4UL> *)in_stack_ffffffffffffc3e0,
                            (size_type)in_stack_ffffffffffffc3d8);
        auVar24._4992_8_ = auVar23._4992_8_;
        auVar24._0_4984_ = auVar23._0_4984_;
        auVar24._4984_8_ = *pvVar7;
        auVar25._4984_16_ = auVar24._4984_16_;
        auVar25._0_4976_ = auVar23._0_4976_;
        auVar25._4976_8_ = 1;
        while (auVar25._4976_8_ < 4) {
          pvVar7 = std::array<long,_4UL>::operator[]
                             ((array<long,_4UL> *)in_stack_ffffffffffffc3e0,
                              (size_type)in_stack_ffffffffffffc3d8);
          auVar26._4992_8_ = auVar25._4992_8_;
          auVar26._0_4984_ = auVar25._0_4984_;
          auVar26._4984_8_ = *pvVar7 * auVar25._4984_8_;
          auVar27._4984_16_ = auVar26._4984_16_;
          auVar27._0_4976_ = auVar25._0_4976_;
          auVar27._4976_8_ = auVar25._4976_8_ + 1;
          auVar25 = auVar27;
        }
        lVar8 = ggml_row_size(local_2780,auVar25._4984_8_);
        auVar28._4880_120_ = auVar25._4880_120_;
        auVar28._0_4872_ = auVar25._0_4872_;
        auVar28._4872_8_ = lVar8;
        local_2778 = ((lVar8 + (ulong)local_2770) - 1 & (ulong)(local_2770 - 1 ^ 0xffffffff)) +
                     local_2778;
      }
      std::__cxx11::string::~string(local_27c8);
      local_277c = local_277c + 1;
    }
    local_1 = local_2765 & 1;
    std::
    vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
    ::~vector(in_stack_ffffffffffffc3f0);
  }
  return (bool)(local_1 & 1);
}

Assistant:

static bool handcrafted_check_tensors(const gguf_context * gguf_ctx, const unsigned int seed) {
    if (!gguf_ctx) {
        return false;
    }

    std::mt19937 rng(seed);

    std::vector<tensor_config_t> tensor_configs = get_tensor_configs(rng);

    // Call get_kv_types to get the same RNG state:
    get_kv_types(rng);

    bool ok = true;

    const int id_alignment = gguf_find_key(gguf_ctx, GGUF_KEY_GENERAL_ALIGNMENT);
    const uint32_t alignment = id_alignment >= 0 ? gguf_get_val_u32(gguf_ctx, id_alignment) : GGUF_DEFAULT_ALIGNMENT;

    uint64_t expected_offset = 0;
    for (int i = 0; i < int(tensor_configs.size()); ++i) {
        const ggml_type                          type  = tensor_configs[i].first;
        const std::array<int64_t, GGML_MAX_DIMS> shape = tensor_configs[i].second;

        const std::string name = "my_tensor_" + std::to_string(i);
        const int id = gguf_find_tensor(gguf_ctx, name.c_str());

        if (id >= 0) {
            if (std::string(gguf_get_tensor_name(gguf_ctx, id)) != name) {
                ok = false;
            }

            if (gguf_get_tensor_type(gguf_ctx, id) != type) {
                ok = false;
            }
        } else {
            ok = false;
            continue;
        }

        const size_t offset = gguf_get_tensor_offset(gguf_ctx, id);

        if (offset != expected_offset) {
            ok = false;
        }

        int64_t ne = shape[0];
        for (size_t j = 1; j < GGML_MAX_DIMS; ++j) {
            ne *= shape[j];
        }
        expected_offset += GGML_PAD(ggml_row_size(type, ne), alignment);
    }

    return ok;
}